

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsimd_cpuid.hpp
# Opt level: O3

void __thiscall xsimd::detail::supported_arch::supported_arch(supported_arch *this)

{
  long lVar1;
  long lVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  
  lVar1 = cpuid_Version_info(1);
  uVar6 = *(uint *)(lVar1 + 0xc);
  uVar10 = 0x27d8;
  if ((*(uint *)(lVar1 + 8) >> 0x1a & 1) == 0) {
    uVar10 = 0;
  }
  uVar11 = -(uVar6 & 1) & 0x283c;
  if (uVar11 < uVar10) {
    uVar11 = uVar10;
  }
  uVar10 = (int)(uVar6 << 0x16) >> 0x1f & 0x283d;
  if (uVar10 < uVar11) {
    uVar10 = uVar11;
  }
  uVar11 = (int)(uVar6 << 0xc) >> 0x1f & 0x28a1;
  if (uVar11 < uVar10) {
    uVar11 = uVar10;
  }
  uVar10 = (int)(uVar6 << 0xb) >> 0x1f & 0x28a2;
  if (uVar10 < uVar11) {
    uVar10 = uVar11;
  }
  uVar11 = uVar6 >> 6 & 0x40;
  uVar16 = uVar6 >> 0x10 & 0x10;
  if (uVar16 != 0) {
    uVar9 = 0x28a3;
    if (uVar11 == 0) {
      uVar9 = 0;
    }
    if (uVar10 <= uVar9) {
      uVar10 = uVar9;
    }
  }
  uVar16 = uVar16 | uVar11 |
           uVar6 >> 7 & 4 | uVar6 >> 0x10 & 8 | *(uint *)(lVar1 + 8) >> 0x1a & 1 | uVar6 * 2 & 2;
  uVar11 = (int)(uVar6 << 3) >> 0x1f & 0x4e84;
  if (uVar11 < uVar10) {
    uVar11 = uVar10;
  }
  uVar9 = uVar16 << 4 & uVar6 >> 0x12;
  uVar10 = (int)(uVar9 << 0x15) >> 0x1f & 0x4e85;
  if (uVar10 < uVar11) {
    uVar10 = uVar11;
  }
  lVar1 = cpuid(0x80000001);
  uVar11 = (int)(*(uint *)(lVar1 + 0xc) << 0xf) >> 0x1f & 0x28a4;
  if (uVar11 < uVar10) {
    uVar11 = uVar10;
  }
  lVar2 = cpuid_Extended_Feature_Enumeration_info(7);
  uVar10 = *(uint *)(lVar2 + 4);
  uVar4 = *(uint *)(lVar2 + 0xc);
  uVar17 = (uVar10 & 0x20) * 0x40;
  uVar14 = (int)(uVar10 << 0x1a) >> 0x1f & 0x4ee8;
  if (uVar14 < uVar11) {
    uVar14 = uVar11;
  }
  puVar3 = (uint *)cpuid_Extended_Feature_Enumeration_info(7);
  uVar5 = (*puVar3 & 0x10) * 0x100;
  uVar11 = 0x4f4c;
  if (uVar5 + uVar17 != 0x1800) {
    uVar11 = 0;
  }
  if (uVar11 < uVar14) {
    uVar11 = uVar14;
  }
  uVar13 = uVar16 << 7 & uVar10 << 8;
  uVar14 = (int)(uVar13 << 0x12) >> 0x1f & 0x4ee9;
  if (uVar14 < uVar11) {
    uVar14 = uVar11;
  }
  uVar7 = uVar10 >> 2 & 0x4000;
  uVar8 = (int)(uVar10 << 0xf) >> 0x1f;
  uVar11 = uVar8 & 0x7594;
  if ((uVar8 & 0x7594) < uVar14) {
    uVar11 = uVar14;
  }
  uVar18 = uVar10 >> 0xd & 0x8000;
  uVar14 = 0x75f8;
  if (uVar7 + uVar18 != 0xc000) {
    uVar14 = 0;
  }
  if (uVar14 < uVar11) {
    uVar14 = uVar11;
  }
  uVar18 = uVar10 >> 1 & 0x10000 | uVar18;
  uVar11 = 0x765c;
  if (uVar18 != 0x18000) {
    uVar11 = 0;
  }
  uVar12 = uVar11 & uVar8;
  if ((uVar11 & uVar8) < uVar14) {
    uVar12 = uVar14;
  }
  uVar16 = (uVar10 >> 0xd & 0x20000 | uVar16) + (uVar6 >> 0x13 & 0x200) + (uVar9 & 0x400);
  uVar18 = uVar7 | uVar13 & 0x2000 | uVar18;
  uVar11 = 0;
  uVar6 = 0x76c0;
  if ((~(uVar18 | uVar16) & 0x3c000) != 0) {
    uVar6 = 0;
  }
  if (uVar6 < uVar12) {
    uVar6 = uVar12;
  }
  uVar14 = uVar10 >> 9 & 0x40000;
  uVar9 = 0x765d;
  if ((~(uVar18 | uVar14) & 0x48000) != 0) {
    uVar9 = uVar11;
  }
  uVar13 = uVar9 & uVar8;
  if ((uVar9 & uVar8) < uVar6) {
    uVar13 = uVar6;
  }
  uVar9 = uVar10 >> 7 & 0x80000;
  uVar6 = 0;
  if ((~(uVar18 | uVar14 | uVar9) & 0xcc000) == 0) {
    uVar6 = 0x76c1;
  }
  if (uVar6 < uVar13) {
    uVar6 = uVar13;
  }
  uVar13 = uVar10 >> 1 & 0x100000;
  uVar10 = 0x7724;
  if ((~(uVar18 | uVar16 & 0xffe3ffff | uVar13) & 0x138000) != 0) {
    uVar10 = uVar11;
  }
  uVar7 = uVar10 & uVar8;
  if ((uVar10 & uVar8) < uVar6) {
    uVar7 = uVar6;
  }
  uVar15 = (uVar4 & 0x800) * 0x800;
  uVar12 = (uVar4 & 0x800) * 0x1000 & uVar4 << 0x16;
  uVar10 = uVar18 | uVar16 & 0xffc3ffff | *(uint *)(lVar1 + 0xc) >> 9 & 0x80 | uVar17 | uVar5 |
           uVar14 | uVar9 | uVar13 | (uVar4 & 2) << 0x14;
  uVar6 = 0x7788;
  if ((~uVar10 & 0x33c000) != 0) {
    uVar6 = uVar11;
  }
  if (uVar6 < uVar7) {
    uVar6 = uVar7;
  }
  uVar11 = 0;
  if ((~(uVar10 | uVar15) & 0x438000) == 0) {
    uVar11 = 0x76c1;
  }
  uVar16 = uVar11 & uVar8;
  if ((uVar11 & uVar8) < uVar6) {
    uVar16 = uVar6;
  }
  *(uint *)this = uVar10 | uVar15 | uVar12;
  uVar6 = 0x7789;
  if (uVar12 == 0) {
    uVar6 = 0;
  }
  if (uVar6 < uVar16) {
    uVar6 = uVar16;
  }
  this->best = uVar6;
  return;
}

Assistant:

inline supported_arch() noexcept
            {
                memset(this, 0, sizeof(supported_arch));

#if defined(__aarch64__) || defined(_M_ARM64)
                neon = 1;
                neon64 = 1;
                best = neon64::version();
#elif defined(__ARM_NEON) || defined(_M_ARM)

#if defined(__linux__) && (!defined(__ANDROID_API__) || __ANDROID_API__ >= 18)
                neon = bool(getauxval(AT_HWCAP) & HWCAP_NEON);
#else
                // that's very conservative :-/
                neon = 0;
#endif
                neon64 = 0;
                best = neon::version() * neon;

#elif defined(__ARM_FEATURE_SVE) && defined(__ARM_FEATURE_SVE_BITS) && __ARM_FEATURE_SVE_BITS > 0

#if defined(__linux__) && (!defined(__ANDROID_API__) || __ANDROID_API__ >= 18)
                sve = bool(getauxval(AT_HWCAP) & HWCAP_SVE);
#else
                sve = 0;
#endif
                best = sve::version() * sve;

#elif defined(__riscv_vector) && defined(__riscv_v_fixed_vlen) && __riscv_v_fixed_vlen > 0

#if defined(__linux__) && (!defined(__ANDROID_API__) || __ANDROID_API__ >= 18)
#ifndef HWCAP_V
#define HWCAP_V (1 << ('V' - 'A'))
#endif
                rvv = bool(getauxval(AT_HWCAP) & HWCAP_V);
#else
                rvv = 0;
#endif

                best = ::xsimd::rvv::version() * rvv;
#elif defined(__x86_64__) || defined(__i386__) || defined(_M_AMD64) || defined(_M_IX86)
                auto get_cpuid = [](int reg[4], int level, int count = 0) noexcept
                {

#if defined(_MSC_VER)
                    __cpuidex(reg, level, count);

#elif defined(__INTEL_COMPILER)
                    __cpuid(reg, level);

#elif defined(__GNUC__) || defined(__clang__)

#if defined(__i386__) && defined(__PIC__)
                    // %ebx may be the PIC register
                    __asm__("xchg{l}\t{%%}ebx, %1\n\t"
                            "cpuid\n\t"
                            "xchg{l}\t{%%}ebx, %1\n\t"
                            : "=a"(reg[0]), "=r"(reg[1]), "=c"(reg[2]),
                              "=d"(reg[3])
                            : "0"(level), "2"(count));

#else
                    __asm__("cpuid\n\t"
                            : "=a"(reg[0]), "=b"(reg[1]), "=c"(reg[2]),
                              "=d"(reg[3])
                            : "0"(level), "2"(count));
#endif

#else
#error "Unsupported configuration"
#endif
                };

                int regs1[4];

                get_cpuid(regs1, 0x1);

                sse2 = regs1[3] >> 26 & 1;
                best = std::max(best, sse2::version() * sse2);

                sse3 = regs1[2] >> 0 & 1;
                best = std::max(best, sse3::version() * sse3);

                ssse3 = regs1[2] >> 9 & 1;
                best = std::max(best, ssse3::version() * ssse3);

                sse4_1 = regs1[2] >> 19 & 1;
                best = std::max(best, sse4_1::version() * sse4_1);

                sse4_2 = regs1[2] >> 20 & 1;
                best = std::max(best, sse4_2::version() * sse4_2);

                fma3_sse = regs1[2] >> 12 & 1;
                if (sse4_2)
                    best = std::max(best, fma3<xsimd::sse4_2>::version() * fma3_sse);

                avx = regs1[2] >> 28 & 1;
                best = std::max(best, avx::version() * avx);

                fma3_avx = avx && fma3_sse;
                best = std::max(best, fma3<xsimd::avx>::version() * fma3_avx);

                int regs8[4];
                get_cpuid(regs8, 0x80000001);
                fma4 = regs8[2] >> 16 & 1;
                best = std::max(best, fma4::version() * fma4);

                // sse4a = regs[2] >> 6 & 1;
                // best = std::max(best, XSIMD_X86_AMD_SSE4A_VERSION * sse4a);

                // xop = regs[2] >> 11 & 1;
                // best = std::max(best, XSIMD_X86_AMD_XOP_VERSION * xop);

                int regs7[4];
                get_cpuid(regs7, 0x7);
                avx2 = regs7[1] >> 5 & 1;
                best = std::max(best, avx2::version() * avx2);

                int regs7a[4];
                get_cpuid(regs7a, 0x7, 0x1);
                avxvnni = regs7a[0] >> 4 & 1;
                best = std::max(best, avxvnni::version() * avxvnni * avx2);

                fma3_avx2 = avx2 && fma3_sse;
                best = std::max(best, fma3<xsimd::avx2>::version() * fma3_avx2);

                avx512f = regs7[1] >> 16 & 1;
                best = std::max(best, avx512f::version() * avx512f);

                avx512cd = regs7[1] >> 28 & 1;
                best = std::max(best, avx512cd::version() * avx512cd * avx512f);

                avx512dq = regs7[1] >> 17 & 1;
                best = std::max(best, avx512dq::version() * avx512dq * avx512cd * avx512f);

                avx512bw = regs7[1] >> 30 & 1;
                best = std::max(best, avx512bw::version() * avx512bw * avx512dq * avx512cd * avx512f);

                avx512er = regs7[1] >> 27 & 1;
                best = std::max(best, avx512er::version() * avx512er * avx512cd * avx512f);

                avx512pf = regs7[1] >> 26 & 1;
                best = std::max(best, avx512pf::version() * avx512pf * avx512er * avx512cd * avx512f);

                avx512ifma = regs7[1] >> 21 & 1;
                best = std::max(best, avx512ifma::version() * avx512ifma * avx512bw * avx512dq * avx512cd * avx512f);

                avx512vbmi = regs7[2] >> 1 & 1;
                best = std::max(best, avx512vbmi::version() * avx512vbmi * avx512ifma * avx512bw * avx512dq * avx512cd * avx512f);

                avx512vnni_bw = regs7[2] >> 11 & 1;
                best = std::max(best, avx512vnni<xsimd::avx512bw>::version() * avx512vnni_bw * avx512bw * avx512dq * avx512cd * avx512f);

                avx512vnni_vbmi = avx512vbmi && avx512vnni_bw;
                best = std::max(best, avx512vnni<xsimd::avx512vbmi>::version() * avx512vnni_vbmi);
#endif
            }